

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O2

object * wiz_create_object_from_kind(object_kind *kind)

{
  _Bool _Var1;
  object *poVar2;
  
  _Var1 = tval_is_money_k(kind);
  if (_Var1) {
    poVar2 = make_gold((int)player->depth,kind->name);
    return poVar2;
  }
  poVar2 = object_new();
  object_prep(poVar2,kind,(int)player->depth,RANDOMISE);
  apply_magic(poVar2,(int)player->depth,false,false,false,false);
  return poVar2;
}

Assistant:

static struct object *wiz_create_object_from_kind(struct object_kind *kind)
{
	struct object *obj;

	if (tval_is_money_k(kind)) {
		obj = make_gold(player->depth, kind->name);
	} else {
		obj = object_new();
		object_prep(obj, kind, player->depth, RANDOMISE);

		/* Apply magic (no messages, no artifacts) */
		apply_magic(obj, player->depth, false, false, false, false);
	}

	return obj;
}